

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::WeakDescriptorDataSection_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,string_view prefix,Descriptor *descriptor,
          int index_in_file_messages,Options *options)

{
  string_view pc;
  string_view name;
  undefined4 in_register_0000008c;
  AlphaNum local_148;
  AlphaNum local_118;
  Descriptor *local_e8;
  size_t sStack_e0;
  AlphaNum local_d0;
  AlphaNum local_a0;
  undefined1 local_70 [48];
  FileDescriptor *local_40;
  FileDescriptor *file;
  Options *options_local;
  Descriptor *pDStack_28;
  int index_in_file_messages_local;
  Descriptor *descriptor_local;
  string_view prefix_local;
  
  pDStack_28 = (Descriptor *)prefix._M_str;
  prefix_local._M_len = prefix._M_len;
  options_local._4_4_ = (int)descriptor;
  file = (FileDescriptor *)CONCAT44(in_register_0000008c,index_in_file_messages);
  descriptor_local = (Descriptor *)this;
  prefix_local._M_str = (char *)__return_storage_ptr__;
  local_40 = Descriptor::file(pDStack_28);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_a0,"pb_");
  local_e8 = descriptor_local;
  sStack_e0 = prefix_local._M_len;
  pc._M_str = (char *)prefix_local._M_len;
  pc._M_len = (size_t)descriptor_local;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_d0,pc);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_118,"_");
  absl::lts_20240722::AlphaNum::AlphaNum(&local_148,options_local._4_4_);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_70,&local_a0,&local_d0,&local_118);
  local_70._32_16_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
  name._M_str = (char *)local_40;
  name._M_len = local_70._40_8_;
  UniqueName_abi_cxx11_
            (__return_storage_ptr__,local_70._32_8_,name,file,
             (Options *)CONCAT44(in_register_0000008c,index_in_file_messages));
  std::__cxx11::string::~string((string *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string WeakDescriptorDataSection(absl::string_view prefix,
                                      const Descriptor* descriptor,
                                      int index_in_file_messages,
                                      const Options& options) {
  const auto* file = descriptor->file();

  // To make a compact name we use the index of the object in its file
  // of its name.
  // So the name could be `pb_def_3_HASH` instead of
  // `pd_def_VeryLongClassName_WithNesting_AndMoreNames_HASH`
  // We need a know common prefix to merge the sections later on.
  return UniqueName(absl::StrCat("pb_", prefix, "_", index_in_file_messages),
                    file, options);
}